

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horz_superres_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_188076a::HorzSuperresFixedEndToEndTest::SetUp
          (HorzSuperresFixedEndToEndTest *this)

{
  aom_bit_depth_t aVar1;
  int iVar2;
  
  libaom_test::EncoderTest::InitializeConfig(&this->super_EncoderTest,kTwoPassGood);
  (this->super_EncoderTest).cfg_.g_lag_in_frames = 5;
  (this->super_EncoderTest).cfg_.rc_end_usage = AOM_VBR;
  (this->super_EncoderTest).cfg_.rc_target_bitrate = 0x28;
  (this->super_EncoderTest).cfg_.g_error_resilient = 0;
  aVar1 = (this->test_video_param_).bit_depth;
  (this->super_EncoderTest).cfg_.g_profile = (this->test_video_param_).profile;
  (this->super_EncoderTest).cfg_.g_input_bit_depth = aVar1;
  (this->super_EncoderTest).cfg_.g_bit_depth = aVar1;
  (this->super_EncoderTest).init_flags_ = (ulong)(8 < (int)aVar1) << 0x12 | 0x10000;
  iVar2 = this->superres_denom_;
  (this->super_EncoderTest).cfg_.rc_superres_mode = this->superres_mode_;
  (this->super_EncoderTest).cfg_.rc_superres_denominator = iVar2;
  (this->super_EncoderTest).cfg_.rc_superres_kf_denominator = this->superres_kf_denom_;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(::libaom_test::kTwoPassGood);
    cfg_.g_lag_in_frames = 5;
    cfg_.rc_end_usage = AOM_VBR;
    cfg_.rc_target_bitrate = kBitrate;
    cfg_.g_error_resilient = 0;
    cfg_.g_profile = test_video_param_.profile;
    cfg_.g_input_bit_depth = (unsigned int)test_video_param_.bit_depth;
    cfg_.g_bit_depth = test_video_param_.bit_depth;
    init_flags_ = AOM_CODEC_USE_PSNR;
    if (cfg_.g_bit_depth > 8) init_flags_ |= AOM_CODEC_USE_HIGHBITDEPTH;

    // Set superres parameters
    cfg_.rc_superres_mode = superres_mode_;
    cfg_.rc_superres_denominator = superres_denom_;
    cfg_.rc_superres_kf_denominator = superres_kf_denom_;
  }